

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlChar * xmlSchemaGetComponentName(xmlSchemaBasicItemPtr item)

{
  xmlSchemaTypeType xVar1;
  xmlChar *pxVar2;
  
  pxVar2 = (xmlChar *)0x0;
  while( true ) {
    if (item == (xmlSchemaBasicItemPtr)0x0) {
      return pxVar2;
    }
    xVar1 = item->type;
    if (xVar1 != XML_SCHEMA_TYPE_ATTRIBUTE_USE) break;
    item = (xmlSchemaBasicItemPtr)item[1].dummy;
    if (item == (xmlSchemaBasicItemPtr)0x0) {
      return pxVar2;
    }
  }
  switch(xVar1) {
  case XML_SCHEMA_TYPE_BASIC:
  case XML_SCHEMA_TYPE_SIMPLE:
  case XML_SCHEMA_TYPE_COMPLEX:
  case XML_SCHEMA_TYPE_ELEMENT:
  case XML_SCHEMA_TYPE_ATTRIBUTE:
  case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
    return *(xmlChar **)(item + 1);
  case XML_SCHEMA_TYPE_ANY:
  case XML_SCHEMA_TYPE_FACET:
  case XML_SCHEMA_TYPE_SEQUENCE:
  case XML_SCHEMA_TYPE_CHOICE:
  case XML_SCHEMA_TYPE_ALL:
  case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
  case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
  case XML_SCHEMA_TYPE_UR:
  case XML_SCHEMA_TYPE_RESTRICTION:
  case XML_SCHEMA_TYPE_EXTENSION:
  case XML_SCHEMA_TYPE_LIST:
  case XML_SCHEMA_TYPE_UNION:
  case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
    return pxVar2;
  case XML_SCHEMA_TYPE_GROUP:
  case XML_SCHEMA_TYPE_IDC_UNIQUE:
  case XML_SCHEMA_TYPE_IDC_KEY:
  case XML_SCHEMA_TYPE_IDC_KEYREF:
    return *(xmlChar **)(item + 2);
  case XML_SCHEMA_TYPE_NOTATION:
    return (xmlChar *)item->dummy;
  }
  if (xVar1 != XML_SCHEMA_EXTRA_QNAMEREF) {
    return pxVar2;
  }
  return (xmlChar *)item[1].dummy;
}

Assistant:

static const xmlChar *
xmlSchemaGetComponentName(xmlSchemaBasicItemPtr item)
{
    if (item == NULL) {
        return (NULL);
    }
    switch (item->type) {
	case XML_SCHEMA_TYPE_ELEMENT:
	    return (((xmlSchemaElementPtr) item)->name);
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return (((xmlSchemaAttributePtr) item)->name);
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return (((xmlSchemaAttributeGroupPtr) item)->name);
	case XML_SCHEMA_TYPE_BASIC:
	case XML_SCHEMA_TYPE_SIMPLE:
	case XML_SCHEMA_TYPE_COMPLEX:
	    return (((xmlSchemaTypePtr) item)->name);
	case XML_SCHEMA_TYPE_GROUP:
	    return (((xmlSchemaModelGroupDefPtr) item)->name);
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return (((xmlSchemaIDCPtr) item)->name);
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    if (WXS_ATTRUSE_DECL(item) != NULL) {
		return(xmlSchemaGetComponentName(
		    WXS_BASIC_CAST WXS_ATTRUSE_DECL(item)));
	    } else
		return(NULL);
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return (((xmlSchemaQNameRefPtr) item)->name);
	case XML_SCHEMA_TYPE_NOTATION:
	    return (((xmlSchemaNotationPtr) item)->name);
	default:
	    /*
	    * Other components cannot have names.
	    */
	    break;
    }
    return (NULL);
}